

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbf_reader.hpp
# Opt level: O0

float __thiscall protozero::pbf_reader::get_fixed<float>(pbf_reader *this)

{
  float *pfVar1;
  char *tmp_data;
  float result;
  pbf_reader *this_local;
  
  pfVar1 = (float *)this->m_data;
  skip_bytes(this,4);
  return *pfVar1;
}

Assistant:

T get_fixed() {
        T result;
        const char* tmp_data = m_data;
        skip_bytes(sizeof(T));
        std::memcpy(&result, tmp_data, sizeof(T));
#if PROTOZERO_BYTE_ORDER != PROTOZERO_LITTLE_ENDIAN
        byteswap_inplace(&result);
#endif
        return result;
    }